

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_generators.hpp
# Opt level: O0

void __thiscall
Catch::Generators::Generators<fd::AccuracyOrder>::
Generators<Catch::Generators::GeneratorWrapper<fd::AccuracyOrder>,fd::AccuracyOrder,fd::AccuracyOrder,fd::AccuracyOrder>
          (Generators<fd::AccuracyOrder> *this,GeneratorWrapper<fd::AccuracyOrder> *moreGenerators,
          AccuracyOrder *moreGenerators_1,AccuracyOrder *moreGenerators_2,
          AccuracyOrder *moreGenerators_3)

{
  AccuracyOrder *moreGenerators_local_3;
  AccuracyOrder *moreGenerators_local_2;
  AccuracyOrder *moreGenerators_local_1;
  GeneratorWrapper<fd::AccuracyOrder> *moreGenerators_local;
  Generators<fd::AccuracyOrder> *this_local;
  
  IGenerator<fd::AccuracyOrder>::IGenerator(&this->super_IGenerator<fd::AccuracyOrder>);
  (this->super_IGenerator<fd::AccuracyOrder>).super_GeneratorUntypedBase._vptr_GeneratorUntypedBase
       = (_func_int **)&PTR_next_00337e90;
  std::
  vector<Catch::Generators::GeneratorWrapper<fd::AccuracyOrder>,_std::allocator<Catch::Generators::GeneratorWrapper<fd::AccuracyOrder>_>_>
  ::vector(&this->m_generators);
  this->m_current = 0;
  std::
  vector<Catch::Generators::GeneratorWrapper<fd::AccuracyOrder>,_std::allocator<Catch::Generators::GeneratorWrapper<fd::AccuracyOrder>_>_>
  ::reserve(&this->m_generators,4);
  add_generators<Catch::Generators::GeneratorWrapper<fd::AccuracyOrder>,fd::AccuracyOrder,fd::AccuracyOrder,fd::AccuracyOrder>
            (this,moreGenerators,moreGenerators_1,moreGenerators_2,moreGenerators_3);
  return;
}

Assistant:

Generators(Gs &&... moreGenerators) {
            m_generators.reserve(sizeof...(Gs));
            add_generators(CATCH_FORWARD(moreGenerators)...);
        }